

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::DriveStrengthSyntax::setChild
          (DriveStrengthSyntax *this,size_t index,TokenOrSyntax child)

{
  logic_error *this_00;
  Token TVar1;
  string local_140;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined8 local_68;
  Info *local_60;
  undefined8 local_58;
  Info *local_50;
  undefined8 local_48;
  Info *local_40;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  DriveStrengthSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    TVar1 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar1._0_8_;
    (this->openParen).kind = (undefined2)local_28;
    (this->openParen).field_0x2 = local_28._2_1_;
    (this->openParen).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->openParen).rawLen = local_28._4_4_;
    local_20 = TVar1.info;
    (this->openParen).info = local_20;
    break;
  case 1:
    TVar1 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar1._0_8_;
    (this->strength0).kind = (undefined2)local_38;
    (this->strength0).field_0x2 = local_38._2_1_;
    (this->strength0).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->strength0).rawLen = local_38._4_4_;
    local_30 = TVar1.info;
    (this->strength0).info = local_30;
    break;
  case 2:
    TVar1 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_48 = TVar1._0_8_;
    (this->comma).kind = (undefined2)local_48;
    (this->comma).field_0x2 = local_48._2_1_;
    (this->comma).numFlags = (NumericTokenFlags)local_48._3_1_;
    (this->comma).rawLen = local_48._4_4_;
    local_40 = TVar1.info;
    (this->comma).info = local_40;
    break;
  case 3:
    TVar1 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_58 = TVar1._0_8_;
    (this->strength1).kind = (undefined2)local_58;
    (this->strength1).field_0x2 = local_58._2_1_;
    (this->strength1).numFlags = (NumericTokenFlags)local_58._3_1_;
    (this->strength1).rawLen = local_58._4_4_;
    local_50 = TVar1.info;
    (this->strength1).info = local_50;
    break;
  case 4:
    TVar1 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_68 = TVar1._0_8_;
    (this->closeParen).kind = (undefined2)local_68;
    (this->closeParen).field_0x2 = local_68._2_1_;
    (this->closeParen).numFlags = (NumericTokenFlags)local_68._3_1_;
    (this->closeParen).rawLen = local_68._4_4_;
    local_60 = TVar1.info;
    (this->closeParen).info = local_60;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_109);
    std::operator+(&local_e8,&local_108,":");
    std::__cxx11::to_string(&local_140,0x128d);
    std::operator+(&local_c8,&local_e8,&local_140);
    std::operator+(&local_a8,&local_c8,": ");
    std::operator+(&local_88,&local_a8,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_88);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void DriveStrengthSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openParen = child.token(); return;
        case 1: strength0 = child.token(); return;
        case 2: comma = child.token(); return;
        case 3: strength1 = child.token(); return;
        case 4: closeParen = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}